

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_hq.c
# Opt level: O0

void BrotliZopfliCreateCommands
               (size_t num_bytes,size_t block_start,size_t max_backward_limit,ZopfliNode *nodes,
               int *dist_cache,size_t *last_insert_len,BrotliEncoderParams *params,
               Command_conflict *commands,size_t *num_literals)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  byte bVar5;
  uint uVar6;
  ZopfliNode *pZVar7;
  ulong uVar8;
  long lVar9;
  byte bVar10;
  int iVar11;
  uint32_t uVar12;
  ulong uVar13;
  ulong uVar14;
  Command_conflict *pCVar15;
  uint local_224;
  ulong local_220;
  size_t dist_code;
  int is_dictionary;
  size_t max_distance;
  size_t len_code;
  size_t distance;
  size_t insert_length;
  size_t copy_length;
  ZopfliNode *next;
  size_t gap;
  size_t i;
  long lStack_1c0;
  uint32_t offset;
  size_t pos;
  size_t *last_insert_len_local;
  int *dist_cache_local;
  ZopfliNode *nodes_local;
  size_t max_backward_limit_local;
  size_t block_start_local;
  size_t num_bytes_local;
  uint32_t modifier;
  uint32_t short_code;
  uint32_t delta;
  size_t nbits;
  size_t offset_1;
  size_t prefix;
  size_t postfix;
  size_t postfix_mask;
  size_t bucket;
  size_t dist;
  uint16_t copycode;
  uint16_t inscode;
  uint32_t nbits_1;
  ushort local_5a;
  uint32_t nbits_2;
  ushort local_32;
  int offset_2;
  uint16_t bits64;
  ushort local_a;
  
  lStack_1c0 = 0;
  i._4_4_ = (nodes->u).next;
  gap = 0;
  while (i._4_4_ != 0xffffffff) {
    pZVar7 = nodes + lStack_1c0 + (ulong)i._4_4_;
    uVar6 = pZVar7->length & 0x1ffffff;
    distance = (size_t)(pZVar7->dcode_insert_length & 0x7ffffff);
    lStack_1c0 = distance + lStack_1c0;
    i._4_4_ = (pZVar7->u).next;
    if (gap == 0) {
      distance = *last_insert_len + distance;
      *last_insert_len = 0;
    }
    uVar1 = pZVar7->distance;
    uVar13 = block_start + lStack_1c0;
    local_220 = max_backward_limit;
    if (uVar13 < max_backward_limit) {
      local_220 = uVar13;
    }
    local_224 = pZVar7->dcode_insert_length >> 0x1b;
    if (local_224 == 0) {
      local_224 = pZVar7->distance + 0xf;
    }
    else {
      local_224 = local_224 - 1;
    }
    uVar13 = (ulong)local_224;
    pCVar15 = commands + gap;
    iVar11 = (((pZVar7->length & 0x1ffffff) + 9) - (pZVar7->length >> 0x19)) - uVar6;
    uVar12 = (uint32_t)distance;
    pCVar15->insert_len_ = uVar12;
    pCVar15->copy_len_ = uVar6 | iVar11 * 0x2000000;
    uVar2 = (params->dist).num_direct_distance_codes;
    uVar3 = (params->dist).distance_postfix_bits;
    if (uVar13 < (ulong)uVar2 + 0x10) {
      pCVar15->dist_prefix_ = (uint16_t)local_224;
      pCVar15->dist_extra_ = 0;
    }
    else {
      bVar5 = (byte)uVar3;
      uVar14 = (1L << (bVar5 + 2 & 0x3f)) + ((uVar13 - 0x10) - (ulong)uVar2);
      iVar4 = 0x1f;
      if ((uint)uVar14 != 0) {
        for (; (uint)uVar14 >> iVar4 == 0; iVar4 = iVar4 + -1) {
        }
      }
      bVar10 = (byte)(iVar4 - 1U);
      uVar8 = uVar14 >> (bVar10 & 0x3f) & 1;
      lVar9 = (ulong)(iVar4 - 1U) - (ulong)uVar3;
      pCVar15->dist_prefix_ =
           (short)lVar9 * 0x400 |
           (short)uVar2 + 0x10 + (short)((lVar9 + -1) * 2 + uVar8 << (bVar5 & 0x3f)) +
           ((ushort)uVar14 & (short)(1 << (bVar5 & 0x1f)) - 1U);
      pCVar15->dist_extra_ = (uint32_t)(uVar14 - (uVar8 + 2 << (bVar10 & 0x3f)) >> (bVar5 & 0x3f));
    }
    iVar11 = uVar6 + iVar11;
    uVar14 = (ulong)iVar11;
    if (distance < 6) {
      local_5a = (ushort)distance;
    }
    else if (distance < 0x82) {
      iVar4 = 0x1f;
      if (uVar12 - 2 != 0) {
        for (; uVar12 - 2 >> iVar4 == 0; iVar4 = iVar4 + -1) {
        }
      }
      local_5a = (short)(iVar4 + -1) * 2 + (short)(distance - 2 >> ((byte)(iVar4 + -1) & 0x3f)) + 2;
    }
    else if (distance < 0x842) {
      iVar4 = 0x1f;
      if (uVar12 - 0x42 != 0) {
        for (; uVar12 - 0x42 >> iVar4 == 0; iVar4 = iVar4 + -1) {
        }
      }
      local_5a = (short)iVar4 + 10;
    }
    else if (distance < 0x1842) {
      local_5a = 0x15;
    }
    else if (distance < 0x5842) {
      local_5a = 0x16;
    }
    else {
      local_5a = 0x17;
    }
    if (uVar14 < 10) {
      local_32 = (short)iVar11 - 2;
    }
    else if (uVar14 < 0x86) {
      iVar4 = 0x1f;
      if (iVar11 - 6U != 0) {
        for (; iVar11 - 6U >> iVar4 == 0; iVar4 = iVar4 + -1) {
        }
      }
      local_32 = (short)(iVar4 + -1) * 2 + (short)(uVar14 - 6 >> ((byte)(iVar4 + -1) & 0x3f)) + 4;
    }
    else if (uVar14 < 0x846) {
      iVar4 = 0x1f;
      if (iVar11 - 0x46U != 0) {
        for (; iVar11 - 0x46U >> iVar4 == 0; iVar4 = iVar4 + -1) {
        }
      }
      local_32 = (short)iVar4 + 0xc;
    }
    else {
      local_32 = 0x17;
    }
    local_a = local_32 & 7 | (local_5a & 7) << 3;
    if ((((pCVar15->dist_prefix_ & 0x3ff) == 0) && (local_5a < 8)) && (local_32 < 0x10)) {
      if (7 < local_32) {
        local_a = local_a | 0x40;
      }
    }
    else {
      iVar11 = ((int)(uint)local_32 >> 3) + ((int)(uint)local_5a >> 3) * 3;
      local_a = (short)iVar11 * 0x40 + 0x40 +
                ((ushort)(0x520d40 >> ((char)iVar11 * '\x02' & 0x1fU)) & 0xc0) | local_a;
    }
    pCVar15->cmd_prefix_ = local_a;
    if ((uVar1 <= local_220) && (uVar13 != 0)) {
      dist_cache[3] = dist_cache[2];
      dist_cache[2] = dist_cache[1];
      dist_cache[1] = *dist_cache;
      *dist_cache = uVar1;
    }
    *num_literals = distance + *num_literals;
    lStack_1c0 = (ulong)uVar6 + lStack_1c0;
    gap = gap + 1;
  }
  *last_insert_len = (num_bytes - lStack_1c0) + *last_insert_len;
  return;
}

Assistant:

void BrotliZopfliCreateCommands(const size_t num_bytes,
                                const size_t block_start,
                                const size_t max_backward_limit,
                                const ZopfliNode* nodes,
                                int* dist_cache,
                                size_t* last_insert_len,
                                const BrotliEncoderParams* params,
                                Command* commands,
                                size_t* num_literals) {
  size_t pos = 0;
  uint32_t offset = nodes[0].u.next;
  size_t i;
  size_t gap = 0;
  for (i = 0; offset != BROTLI_UINT32_MAX; i++) {
    const ZopfliNode* next = &nodes[pos + offset];
    size_t copy_length = ZopfliNodeCopyLength(next);
    size_t insert_length = next->dcode_insert_length & 0x7FFFFFF;
    pos += insert_length;
    offset = next->u.next;
    if (i == 0) {
      insert_length += *last_insert_len;
      *last_insert_len = 0;
    }
    {
      size_t distance = ZopfliNodeCopyDistance(next);
      size_t len_code = ZopfliNodeLengthCode(next);
      size_t max_distance =
          BROTLI_MIN(size_t, block_start + pos, max_backward_limit);
      BROTLI_BOOL is_dictionary = TO_BROTLI_BOOL(distance > max_distance + gap);
      size_t dist_code = ZopfliNodeDistanceCode(next);
      InitCommand(&commands[i], &params->dist, insert_length,
          copy_length, (int)len_code - (int)copy_length, dist_code);

      if (!is_dictionary && dist_code > 0) {
        dist_cache[3] = dist_cache[2];
        dist_cache[2] = dist_cache[1];
        dist_cache[1] = dist_cache[0];
        dist_cache[0] = (int)distance;
      }
    }

    *num_literals += insert_length;
    pos += copy_length;
  }
  *last_insert_len += num_bytes - pos;
}